

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_get_ddos_config_options.cc
# Opt level: O3

int __thiscall
aliyun::Yundun::GetDdosConfigOptions
          (Yundun *this,YundunGetDdosConfigOptionsResponseType *response,YundunErrorInfo *error_info
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  Int IVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *this_01;
  size_type *psVar12;
  vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
  *vec;
  vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
  *vec_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_02;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value local_2f0;
  YundunGetDdosConfigOptionsResponseType *local_2d8;
  allocator<char> local_2c9;
  string local_2c8;
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  vector<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType,std::allocator<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType>>
  *local_288;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_2a8 = local_298;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,this->secret_,&local_2c9);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2a8,local_2a0 + (long)local_2a8);
  std::__cxx11::string::append((char *)&local_140);
  local_2d8 = response;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_280.field_2._M_allocated_capacity = *psVar12;
    local_280.field_2._8_8_ = plVar8[3];
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar12;
    local_280._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_280._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_2f0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"GetDdosConfigOptions","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_2c8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_260);
    if ((0 < iVar4) && (local_260._M_string_length != 0)) {
      bVar3 = Json::Reader::parse(&local_140,&local_260,&local_2f0,true);
      if (bVar3) {
        if (error_info != (YundunErrorInfo *)0x0 && iVar4 != 200) {
          bVar3 = Json::Value::isMember(&local_2f0,"RequestId");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"RequestId");
            Json::Value::asString_abi_cxx11_(&local_2c8,pVVar10);
          }
          else {
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,anon_var_dwarf_1d3d1e + 9);
          }
          std::__cxx11::string::operator=((string *)error_info,(string *)&local_2c8);
          paVar1 = &local_2c8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Json::Value::isMember(&local_2f0,"Code");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"Code");
            Json::Value::asString_abi_cxx11_(&local_2c8,pVVar10);
          }
          else {
            local_2c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,anon_var_dwarf_1d3d1e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Json::Value::isMember(&local_2f0,"HostId");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"HostId");
            Json::Value::asString_abi_cxx11_(&local_2c8,pVVar10);
          }
          else {
            local_2c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,anon_var_dwarf_1d3d1e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Json::Value::isMember(&local_2f0,"Message");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"Message");
            Json::Value::asString_abi_cxx11_(&local_2c8,pVVar10);
          }
          else {
            local_2c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,anon_var_dwarf_1d3d1e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_2d8 != (YundunGetDdosConfigOptionsResponseType *)0x0 && iVar4 == 200) {
          bVar3 = Json::Value::isMember(&local_2f0,"RequestThresholdOptions1");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"RequestThresholdOptions1");
            bVar3 = Json::Value::isMember(pVVar10,"RequestThresholdOption");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](&local_2f0,"RequestThresholdOptions1");
              pVVar10 = Json::Value::operator[](pVVar10,"RequestThresholdOption");
              anon_unknown.dwarf_8e527::
              Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::Json2Array
                        ((Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *
                         )pVVar10,(Value *)local_2d8,vec);
            }
          }
          bVar3 = Json::Value::isMember(&local_2f0,"RequestThresholdOptions2");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"RequestThresholdOptions2");
            bVar3 = Json::Value::isMember(pVVar10,"RequestThresholdOption");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](&local_2f0,"RequestThresholdOptions2");
              pVVar10 = Json::Value::operator[](pVVar10,"RequestThresholdOption");
              anon_unknown.dwarf_8e527::
              Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::Json2Array
                        ((Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *
                         )pVVar10,(Value *)&local_2d8->request_threshold_options2,vec_00);
            }
          }
          bVar3 = Json::Value::isMember(&local_2f0,"ConnectionThresholdOptions");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"ConnectionThresholdOptions");
            bVar3 = Json::Value::isMember(pVVar10,"ConnectionThresholdOption");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](&local_2f0,"ConnectionThresholdOptions");
              pVVar10 = Json::Value::operator[](pVVar10,"ConnectionThresholdOption");
              bVar3 = Json::Value::isArray(pVVar10);
              if (bVar3) {
                AVar5 = Json::Value::size(pVVar10);
                if (AVar5 != 0) {
                  local_288 = (vector<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType,std::allocator<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType>>
                               *)&local_2d8->connection_threshold_options;
                  index = 0;
                  do {
                    pVVar11 = Json::Value::operator[](pVVar10,index);
                    bVar3 = Json::Value::isMember(pVVar11,"Sipconn");
                    if (bVar3) {
                      this_01 = Json::Value::operator[](pVVar11,"Sipconn");
                      IVar6 = Json::Value::asInt(this_01);
                      local_2c8._M_dataplus._M_p = (pointer)(long)IVar6;
                    }
                    bVar3 = Json::Value::isMember(pVVar11,"Sipnew");
                    if (bVar3) {
                      pVVar11 = Json::Value::operator[](pVVar11,"Sipnew");
                      IVar6 = Json::Value::asInt(pVVar11);
                      local_2c8._M_string_length = (size_type)IVar6;
                    }
                    __position._M_current =
                         *(YundunGetDdosConfigOptionsConnectionThresholdOptionType **)
                          &local_2d8->field_0x38;
                    if (__position._M_current ==
                        *(YundunGetDdosConfigOptionsConnectionThresholdOptionType **)
                         &local_2d8->field_0x40) {
                      std::
                      vector<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType,std::allocator<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType>>
                      ::
                      _M_realloc_insert<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType_const&>
                                (local_288,__position,
                                 (YundunGetDdosConfigOptionsConnectionThresholdOptionType *)
                                 &local_2c8);
                    }
                    else {
                      (__position._M_current)->sipconn = (long)local_2c8._M_dataplus._M_p;
                      (__position._M_current)->sipnew = local_2c8._M_string_length;
                      *(long *)&local_2d8->field_0x38 = *(long *)&local_2d8->field_0x38 + 0x10;
                    }
                    AVar5 = Json::Value::size(pVVar10);
                    index = index + 1;
                  } while (index < AVar5);
                }
              }
            }
          }
          bVar3 = Json::Value::isMember(&local_2f0,"QpsOptions1");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"QpsOptions1");
            bVar3 = Json::Value::isMember(pVVar10,"value");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](&local_2f0,"QpsOptions1");
              pVVar10 = Json::Value::operator[](pVVar10,"value");
              anon_unknown.dwarf_8e527::
              Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)pVVar10,(Value *)&local_2d8->qps_options1,vec_01);
            }
          }
          bVar3 = Json::Value::isMember(&local_2f0,"QpsOptions2");
          iVar4 = 200;
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_2f0,"QpsOptions2");
            bVar3 = Json::Value::isMember(pVVar10,"value");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](&local_2f0,"QpsOptions2");
              pVVar10 = Json::Value::operator[](pVVar10,"value");
              anon_unknown.dwarf_8e527::
              Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)pVVar10,(Value *)&local_2d8->qps_options2,vec_02);
            }
          }
        }
        goto LAB_00135e19;
      }
    }
    if (error_info == (YundunErrorInfo *)0x0) goto LAB_00135e14;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (YundunErrorInfo *)0x0) {
LAB_00135e14:
      iVar4 = -1;
      goto LAB_00135e19;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_00135e19:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_2f0);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Yundun::GetDdosConfigOptions(YundunGetDdosConfigOptionsResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","GetDdosConfigOptions");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}